

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall
CVmObjIntClsMod::inh_prop
          (CVmObjIntClsMod *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,
          vm_obj_id_t orig_target_obj,vm_obj_id_t defining_obj,vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  undefined8 in_RDI;
  uint unaff_retaddr;
  undefined6 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = CVmObjTads::search_for_prop_from
                    (unaff_retaddr,
                     (vm_val_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (vm_obj_id_t)((ulong)in_RDI >> 0x20),
                     (vm_obj_id_t *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),
                     (vm_obj_id_t)((ulong)in_RDX >> 0x20));
  return (uint)(iVar1 != 0);
}

Assistant:

int CVmObjIntClsMod::inh_prop(VMG_ vm_prop_id_t prop, vm_val_t *val,
                              vm_obj_id_t self,
                              vm_obj_id_t orig_target_obj,
                              vm_obj_id_t defining_obj,
                              vm_obj_id_t *source_obj, uint *argc)
{
    /* 
     *   try finding the property in our property list or a superclass
     *   property list 
     */
    if (search_for_prop_from(vmg_ prop, val, orig_target_obj,
                             source_obj, defining_obj))
        return TRUE;

    /* 
     *   we didn't find it in our list, and we don't want to inherit from any
     *   intrinsic superclass, so we don't have the property 
     */
    return FALSE;
}